

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.h
# Opt level: O2

Expression __thiscall dynet::RNNBuilder::add_input(RNNBuilder *this,Expression *x)

{
  uint uVar1;
  undefined8 extraout_RDX;
  Expression EVar2;
  
  RNNStateMachine::transition((RNNStateMachine *)(x + 1),add_input);
  std::vector<dynet::RNNPointer,_std::allocator<dynet::RNNPointer>_>::push_back
            ((vector<dynet::RNNPointer,_std::allocator<dynet::RNNPointer>_> *)&x[1].i,
             (value_type *)&x->i);
  uVar1 = (x->i).t;
  (x->i).t = (int)((ulong)((long)x[2].pg - *(long *)&x[1].i) >> 2) - 1;
  (**(code **)(x->pg + 0x68))(this,x,uVar1);
  EVar2._8_8_ = extraout_RDX;
  EVar2.pg = (ComputationGraph *)this;
  return EVar2;
}

Assistant:

Expression add_input(const Expression& x) {
    sm.transition(RNNOp::add_input);
    head.push_back(cur);
    int rcp = cur;
    cur = head.size() - 1;
    return add_input_impl(rcp, x);
  }